

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecSt.c
# Opt level: O2

void Acec_GenerateNpnTable(void)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint local_47c;
  int Classes [16];
  int Table [256];
  
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    uVar1 = Extra_TruthCanonNPN((uint)lVar3,3);
    Table[lVar3] = uVar1;
  }
  local_47c = 0;
  uVar1 = 0;
  do {
    if (0xff < (int)local_47c) {
      return;
    }
    putchar(0x7b);
    Extra_PrintHex(_stdout,(uint *)(Table + (int)local_47c),3);
    printf(", ");
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      if (Table[(int)local_47c] == Classes[uVar2]) {
        uVar4 = uVar2 & 0xffffffff;
        break;
      }
    }
    if ((uint)uVar4 == uVar1) {
      lVar3 = (long)(int)uVar1;
      uVar1 = uVar1 + 1;
      Classes[lVar3] = Table[(int)local_47c];
    }
    printf("%2d}, // ");
    Extra_PrintHex(_stdout,&local_47c,3);
    printf(" = %3d\n",(ulong)local_47c);
    local_47c = local_47c + 1;
  } while( true );
}

Assistant:

void Acec_GenerateNpnTable()
{
    int Table[256], Classes[16], Map[256];
    int i, k, nClasses = 0;
    for ( i = 0; i < 256; i++ )
        Table[i] = Extra_TruthCanonNPN( i, 3 );
    for ( i = 0; i < 256; i++ )
    {
        printf( "{" );
        Extra_PrintHex( stdout, (unsigned *)&Table[i], 3 );
        printf( ", " );
        // find the class
        for ( k = 0; k < nClasses; k++ )
            if ( Table[i] == Classes[k] )
                break;
        if ( k == nClasses )
            Classes[nClasses++] = Table[i];
        Map[i] = k;
        // print
        printf( "%2d}, // ", k );
        Extra_PrintHex( stdout, (unsigned *)&i, 3 );
        printf( " = %3d\n", i );
    }
}